

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O1

char * assignGapColorForKin(float gap,int class)

{
  char *pcVar1;
  
  if (class == 6) {
    return "greentint ";
  }
  if (0.35 < gap) {
    return "blue ";
  }
  if (0.25 < gap) {
    return "sky ";
  }
  if (0.15 < gap) {
    return "sea ";
  }
  if (0.0 < gap) {
    return "green ";
  }
  if (-0.1 < gap) {
    return "yellowtint ";
  }
  if (-0.2 < gap) {
    return "yellow ";
  }
  if (-0.3 < gap) {
    return "orange ";
  }
  pcVar1 = "hotpink ";
  if (-0.4 < gap) {
    pcVar1 = "red ";
  }
  return pcVar1;
}

Assistant:

char* assignGapColorForKin(float gap, int class)
{
   char *colorValue = "";
   //if (class == 4)     { colorValue = "greentint "; } /* hbond */ /* 04/16/2015 SJ changed 4 to 6, as H-bond are now 6 in NODEWIDTH, see probe.h*/
   if (class == 6)     { colorValue = "greentint "; }
   else if (gap > 0.35){ colorValue = "blue ";      }
   else if (gap > 0.25){ colorValue = "sky ";       }
   else if (gap > 0.15){ colorValue = "sea ";       }
   else if (gap > 0.0) { colorValue = "green ";     }
   else if (gap >-0.1) { colorValue = "yellowtint ";}
   else if (gap >-0.2) { colorValue = "yellow ";    }
   else if (gap >-0.3) { colorValue = "orange ";    }
   else if (gap >-0.4) { colorValue = "red ";       }
   else                { colorValue = "hotpink ";   }
   return colorValue;
}